

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result spvc_compiler_require_extension(spvc_compiler compiler,char *line)

{
  CompilerGLSL *this;
  spvc_context this_00;
  spvc_result sVar1;
  allocator local_59;
  string local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (compiler->backend == SPVC_BACKEND_NONE) {
    this_00 = compiler->context;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38,
               "Cross-compilation related option used on NONE backend which only supports reflection."
               ,"");
    std::__cxx11::string::operator=((string *)this_00,(string *)local_38);
    if (this_00->callback != (spvc_error_callback)0x0) {
      (*this_00->callback)(this_00->callback_userdata,(this_00->last_error)._M_dataplus._M_p);
    }
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  else {
    this = (CompilerGLSL *)
           (compiler->compiler)._M_t.
           super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
           .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_58,line,&local_59);
    spirv_cross::CompilerGLSL::require_extension(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    sVar1 = SPVC_SUCCESS;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_require_extension(spvc_compiler compiler, const char *line)
{
#if SPIRV_CROSS_C_API_GLSL
	if (compiler->backend == SPVC_BACKEND_NONE)
	{
		compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	static_cast<CompilerGLSL *>(compiler->compiler.get())->require_extension(line);
	return SPVC_SUCCESS;
#else
	(void)line;
	compiler->context->report_error("Cross-compilation related option used on NONE backend which only supports reflection.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}